

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng.cc
# Opt level: O0

void __thiscall S2LatLng::S2LatLng(S2LatLng *this,S2Point *p)

{
  bool bVar1;
  ostream *poVar2;
  double x;
  double y;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  S1Angle local_28;
  S1Angle local_20;
  S2Point *local_18;
  S2Point *p_local;
  S2LatLng *this_local;
  
  local_18 = p;
  p_local = (S2Point *)this;
  local_20 = Latitude(p);
  x = S1Angle::radians(&local_20);
  local_28 = Longitude(local_18);
  y = S1Angle::radians(&local_28);
  Vector2<double>::Vector2(&this->coords_,x,y);
  bVar1 = is_valid(this);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng.cc"
               ,0x30,kError,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_40);
    poVar2 = std::operator<<(poVar2,"Invalid S2LatLng in constructor: ");
    poVar2 = ::operator<<(poVar2,this);
    S2LogMessageVoidify::operator&(&local_29,poVar2);
    S2LogMessage::~S2LogMessage(&local_40);
  }
  return;
}

Assistant:

S2LatLng::S2LatLng(const S2Point& p)
  : coords_(Latitude(p).radians(), Longitude(p).radians()) {
  // The latitude and longitude are already normalized.
  S2_DLOG_IF(ERROR, !is_valid())
      << "Invalid S2LatLng in constructor: " << *this;
}